

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLgraph.c
# Opt level: O2

void RDL_deleteGraph(RDL_graph *gra)

{
  ulong uVar1;
  
  if (gra != (RDL_graph *)0x0) {
    if (gra->edges != (uint **)0x0) {
      for (uVar1 = 0; uVar1 < gra->E; uVar1 = uVar1 + 1) {
        free(gra->edges[uVar1]);
      }
      free(gra->edges);
    }
    for (uVar1 = 0; uVar1 < gra->V; uVar1 = uVar1 + 1) {
      if (gra->degree[uVar1] != 0) {
        free(gra->adjList[uVar1]);
      }
    }
    free(gra->adjList);
    free(gra->degree);
    free(gra);
    return;
  }
  __assert_fail("gra != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/rareylab[P]RingDecomposerLib/src/RingDecomposerLib/RDLgraph.c"
                ,0x78,"void RDL_deleteGraph(RDL_graph *)");
}

Assistant:

void RDL_deleteGraph(RDL_graph *gra)
{
  unsigned i;
  assert(gra != NULL);
  if(gra->edges)
  {
    for(i=0; i<gra->E; ++i)
    {
      free(gra->edges[i]);
    }
    free(gra->edges);
  }
  for(i=0; i<gra->V; ++i)
  {
    if(gra->degree[i] > 0)
    {
      free(gra->adjList[i]);
    }
  }
  free(gra->adjList);
  free(gra->degree);
  free(gra);
}